

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caches.cpp
# Opt level: O2

CacheSizes *
node::CalculateCacheSizes(CacheSizes *__return_storage_ptr__,ArgsManager *args,size_t n_indexes)

{
  bool bVar1;
  int64_t iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  allocator<char> local_51;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"-dbcache",&local_51);
  iVar2 = ArgsManager::GetIntArg(args,&local_50,0x1c2);
  std::__cxx11::string::~string((string *)&local_50);
  uVar6 = 0x400000;
  if (0x400000 < iVar2 * 0x100000) {
    uVar6 = iVar2 * 0x100000;
  }
  if (0x3ffffffff < (long)uVar6) {
    uVar6 = 0x400000000;
  }
  uVar5 = uVar6 >> 3;
  if (0x1fffff < uVar5) {
    uVar5 = 0x200000;
  }
  __return_storage_ptr__->block_tree_db = uVar5;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"-txindex",&local_51);
  bVar1 = ArgsManager::GetBoolArg(args,&local_50,false);
  uVar4 = uVar6 - uVar5 >> 3;
  if ((uint)bVar1 << 0x1e < uVar4) {
    uVar4 = (ulong)((uint)bVar1 << 0x1e);
  }
  __return_storage_ptr__->tx_index = uVar4;
  std::__cxx11::string::~string((string *)&local_50);
  lVar7 = (uVar6 - uVar5) - uVar4;
  __return_storage_ptr__->filter_index = 0;
  if (n_indexes != 0) {
    uVar6 = lVar7 / 8;
    if (0x3fffffff < (long)uVar6) {
      uVar6 = 0x40000000;
    }
    __return_storage_ptr__->filter_index = uVar6 / n_indexes;
    lVar7 = lVar7 - (uVar6 / n_indexes) * n_indexes;
  }
  lVar3 = lVar7 / 4 + 0x800000;
  if (lVar7 / 2 <= lVar3) {
    lVar3 = lVar7 / 2;
  }
  if (0x7fffff < lVar3) {
    lVar3 = 0x800000;
  }
  __return_storage_ptr__->coins_db = lVar3;
  __return_storage_ptr__->coins = lVar7 - lVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CacheSizes CalculateCacheSizes(const ArgsManager& args, size_t n_indexes)
{
    int64_t nTotalCache = (args.GetIntArg("-dbcache", nDefaultDbCache) << 20);
    nTotalCache = std::max(nTotalCache, nMinDbCache << 20); // total cache cannot be less than nMinDbCache
    nTotalCache = std::min(nTotalCache, nMaxDbCache << 20); // total cache cannot be greater than nMaxDbcache
    CacheSizes sizes;
    sizes.block_tree_db = std::min(nTotalCache / 8, nMaxBlockDBCache << 20);
    nTotalCache -= sizes.block_tree_db;
    sizes.tx_index = std::min(nTotalCache / 8, args.GetBoolArg("-txindex", DEFAULT_TXINDEX) ? nMaxTxIndexCache << 20 : 0);
    nTotalCache -= sizes.tx_index;
    sizes.filter_index = 0;
    if (n_indexes > 0) {
        int64_t max_cache = std::min(nTotalCache / 8, max_filter_index_cache << 20);
        sizes.filter_index = max_cache / n_indexes;
        nTotalCache -= sizes.filter_index * n_indexes;
    }
    sizes.coins_db = std::min(nTotalCache / 2, (nTotalCache / 4) + (1 << 23)); // use 25%-50% of the remainder for disk cache
    sizes.coins_db = std::min(sizes.coins_db, nMaxCoinsDBCache << 20); // cap total coins db cache
    nTotalCache -= sizes.coins_db;
    sizes.coins = nTotalCache; // the rest goes to in-memory cache
    return sizes;
}